

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall wave::File::Impl::set_current_sample_index(Impl *this,uint64_t sample_idx)

{
  char cVar1;
  long lVar2;
  
  lVar2 = ((this->header).fmt.bits_per_sample >> 3) * sample_idx + this->data_offset_;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ostream::seekp(&this->ostream,lVar2,0);
    return;
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::seekg(this,lVar2,0);
    return;
  }
  return;
}

Assistant:

void set_current_sample_index(uint64_t sample_idx) {
    auto bits_per_sample = header.fmt.bits_per_sample;
    auto bytes_per_sample = bits_per_sample / 8;

    std::streampos stream_index =
        data_offset_ + (sample_idx * bytes_per_sample);
    if (ostream.is_open()) {
      ostream.seekp(stream_index);
    } else if (istream.is_open()) {
      istream.seekg(stream_index);
    }
  }